

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_nws_image.cc
# Opt level: O0

void __thiscall NWSImageHandler::handle(NWSImageHandler *this,shared_ptr<const_lrit::File> *f)

{
  bool bVar1;
  element_type *this_00;
  element_type *peVar2;
  undefined1 *__nbytes;
  void *__buf;
  NWSImageHandler *in_RSI;
  timespec *in_RDI;
  timespec tVar3;
  string path;
  unique_ptr<Image,_std::default_delete<Image>_> image;
  string path_1;
  FilenameBuilder fb;
  NOAALRITHeader nlh;
  PrimaryHeader ph;
  Image *in_stack_fffffffffffffb48;
  FilenameBuilder *in_stack_fffffffffffffb50;
  File *in_stack_fffffffffffffb60;
  unique_ptr<Image,_std::default_delete<Image>_> *this_01;
  NWSImageHandler *this_02;
  string *in_stack_fffffffffffffbd8;
  string *in_stack_fffffffffffffbf0;
  File *in_stack_fffffffffffffbf8;
  FileWriter *in_stack_fffffffffffffc00;
  string local_3c8 [32];
  string local_3a8 [32];
  unique_ptr<Image,_std::default_delete<Image>_> local_388 [3];
  undefined4 local_36c;
  undefined1 local_368 [31];
  allocator local_349;
  string *in_stack_fffffffffffffcb8;
  string *in_stack_fffffffffffffcc0;
  FilenameBuilder *in_stack_fffffffffffffcc8;
  string local_328 [32];
  string local_308 [32];
  TimeStampHeader local_2e8;
  TimeStampHeader local_2d8;
  __time_t in_stack_fffffffffffffd38;
  shared_ptr<const_lrit::File> *f_00;
  string local_2b8 [48];
  string local_288 [32];
  string local_268 [32];
  __time_t local_248;
  __syscall_slong_t local_240;
  NOAALRITHeader local_38;
  char local_24;
  
  this_02 = in_RSI;
  std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2a8601);
  lrit::File::getHeader<lrit::PrimaryHeader>((File *)in_stack_fffffffffffffb50);
  if (local_24 == '\0') {
    std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a8630);
    local_38 = lrit::File::getHeader<lrit::NOAALRITHeader>((File *)0x2a8638);
    if (local_38.productID == 6) {
      FilenameBuilder::FilenameBuilder(in_stack_fffffffffffffb50);
      std::__cxx11::string::operator=(local_288,(string *)(in_RDI + 9));
      std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                in_stack_fffffffffffffb50);
      getBasename_abi_cxx11_(this_02,(File *)in_RSI);
      std::__cxx11::string::operator=(local_268,local_2b8);
      std::__cxx11::string::~string(local_2b8);
      std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2a86df);
      bVar1 = lrit::File::hasHeader<lrit::TimeStampHeader>((File *)0x2a86e7);
      if (bVar1) {
        std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a8707);
        local_2e8 = lrit::File::getHeader<lrit::TimeStampHeader>(in_stack_fffffffffffffb60);
        local_2d8 = local_2e8;
        tVar3 = lrit::TimeStampHeader::getUnix(local_2e8._0_8_);
        local_248 = tVar3.tv_sec;
      }
      else {
        anon_unknown.dwarf_112318::parseTime(in_stack_fffffffffffffbd8,in_RDI);
        std::__cxx11::string::operator=(local_268,local_308);
        std::__cxx11::string::~string(local_308);
        tVar3.tv_nsec = local_240;
        tVar3.tv_sec = in_stack_fffffffffffffd38;
      }
      local_240 = tVar3.tv_nsec;
      f_00 = (shared_ptr<const_lrit::File> *)tVar3.tv_sec;
      if (local_38.noaaSpecificCompression == '\x05') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&stack0xfffffffffffffcb8,"gif",&local_349);
        __nbytes = &stack0xfffffffffffffcb8;
        FilenameBuilder::build
                  (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffcb8);
        std::allocator<char>::~allocator((allocator<char> *)&local_349);
        this_00 = std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x2a88a6);
        peVar2 = std::
                 __shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a88b8);
        lrit::File::read((File *)local_368,(int)peVar2,__buf,(size_t)__nbytes);
        FileWriter::write(this_00,(int)local_328,local_368,0);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffb60);
        if ((in_RDI[0xd].tv_sec & 1) != 0) {
          std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x2a8920);
          std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffffb50);
          FileWriter::writeHeader
                    (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
        }
        local_36c = 1;
        std::__cxx11::string::~string(local_328);
      }
      else {
        this_01 = local_388;
        std::shared_ptr<const_lrit::File>::shared_ptr
                  ((shared_ptr<const_lrit::File> *)in_stack_fffffffffffffb50,
                   (shared_ptr<const_lrit::File> *)in_stack_fffffffffffffb48);
        Image::createFromFile(f_00);
        std::shared_ptr<const_lrit::File>::~shared_ptr((shared_ptr<const_lrit::File> *)0x2a8a3a);
        std::__cxx11::string::string(local_3c8,(string *)(in_RDI + 0xb));
        FilenameBuilder::build
                  (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        std::__cxx11::string::~string(local_3c8);
        in_stack_fffffffffffffb50 =
             (FilenameBuilder *)
             std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )0x2a8aab);
        std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                  ((unique_ptr<Image,_std::default_delete<Image>_> *)0x2a8abd);
        Image::getRawImage(in_stack_fffffffffffffb48);
        FileWriter::write((FileWriter *)in_stack_fffffffffffffb50,(int)local_3a8,
                          &stack0xfffffffffffffbd8,0);
        cv::Mat::~Mat((Mat *)&stack0xfffffffffffffbd8);
        if ((in_RDI[0xd].tv_sec & 1) != 0) {
          std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x2a8b25);
          std::__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<const_lrit::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffffb50);
          FileWriter::writeHeader
                    (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
        }
        local_36c = 1;
        std::__cxx11::string::~string(local_3a8);
        std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr(this_01);
      }
      FilenameBuilder::~FilenameBuilder(in_stack_fffffffffffffb50);
    }
  }
  return;
}

Assistant:

void NWSImageHandler::handle(std::shared_ptr<const lrit::File> f) {
  auto ph = f->getHeader<lrit::PrimaryHeader>();
  if (ph.fileType != 0) {
    return;
  }

  // Filter NWS
  auto nlh = f->getHeader<lrit::NOAALRITHeader>();
  if (nlh.productID != 6) {
    return;
  }

  FilenameBuilder fb;
  fb.dir = config_.dir;
  fb.filename = getBasename(*f);

  // In the GOES-15 LRIT stream these text files have a time stamp
  // header; in the GOES-R HRIT stream they don't.
  if (f->hasHeader<lrit::TimeStampHeader>()) {
    fb.time = f->getHeader<lrit::TimeStampHeader>().getUnix();
  } else {
    // If time can successfully be extracted from the filename
    // then remove it from the filename passed to the builder.
    fb.filename = parseTime(fb.filename, fb.time);
  }

  // If this is a GIF we can write it directly
  if (nlh.noaaSpecificCompression == 5) {
    auto path = fb.build(config_.filename, "gif");
    fileWriter_->write(path, f->read());
    if (config_.json) {
      fileWriter_->writeHeader(*f, path);
    }
    return;
  }

  auto image = Image::createFromFile(f);
  auto path = fb.build(config_.filename, config_.format);
  fileWriter_->write(path, image->getRawImage());
  if (config_.json) {
    fileWriter_->writeHeader(*f, path);
  }
  return;
}